

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

void Aig_ManComputeSccs(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *__ptr;
  void *pvVar2;
  long lVar3;
  uint *__ptr_00;
  void *pvVar4;
  undefined8 *puVar5;
  void *pvVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  if (p->nRegs == 0) {
    puts("The network is combinational.");
    return;
  }
  __ptr = Aig_ManSupports(p);
  iVar1 = p->nRegs;
  iVar14 = 8;
  if (6 < iVar1 - 1U) {
    iVar14 = iVar1;
  }
  if (iVar14 == 0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = malloc((long)iVar14 << 3);
  }
  memset(pvVar2,0,(long)iVar1 * 8);
  if (0 < __ptr->nSize) {
    lVar3 = 0;
    do {
      pvVar4 = __ptr->pArray[lVar3];
      if (*(int *)((long)pvVar4 + 4) < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      lVar16 = *(long *)((long)pvVar4 + 8);
      uVar9 = *(int *)((long)pvVar4 + 4) - 1;
      *(uint *)((long)pvVar4 + 4) = uVar9;
      uVar9 = (p->nRegs - p->nObjs[3]) + *(int *)(lVar16 + (ulong)uVar9 * 4);
      if (-1 < (int)uVar9) {
        uVar12 = *(uint *)((long)pvVar4 + 4);
        uVar13 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar10 = 0;
        }
        else {
          lVar11 = 0;
          uVar10 = 0;
          do {
            iVar14 = (p->nRegs - p->nObjs[2]) + *(int *)(lVar16 + lVar11 * 4);
            if (-1 < iVar14) {
              if (p->nRegs <= iVar14) {
                __assert_fail("iIn < Aig_ManRegNum(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                              ,0x206,"void Aig_ManComputeSccs(Aig_Man_t *)");
              }
              if (((int)uVar10 < 0) || ((int)uVar13 <= (int)uVar10)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar13 = (ulong)uVar10;
              uVar10 = uVar10 + 1;
              *(int *)(lVar16 + uVar13 * 4) = iVar14;
            }
            lVar11 = lVar11 + 1;
            uVar12 = *(uint *)((long)pvVar4 + 4);
            uVar13 = (ulong)(int)uVar12;
          } while (lVar11 < (long)uVar13);
        }
        if ((int)uVar12 < (int)uVar10) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        *(uint *)((long)pvVar4 + 4) = uVar10;
        if (p->nRegs <= (int)uVar9) {
          __assert_fail("iOut < Aig_ManRegNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                        ,0x20b,"void Aig_ManComputeSccs(Aig_Man_t *)");
        }
        if (iVar1 <= (int)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        *(void **)((long)pvVar2 + (ulong)uVar9 * 8) = pvVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < __ptr->nSize);
  }
  uVar9 = p->nRegs;
  __ptr_00 = (uint *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar9 - 1) {
    uVar12 = uVar9;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar12;
  if (uVar12 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar12 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar4;
  if (0 < p->nRegs) {
    uVar9 = *__ptr_00;
    uVar12 = __ptr_00[1];
    pvVar4 = *(void **)(__ptr_00 + 2);
    lVar3 = 0;
    do {
      puVar5 = (undefined8 *)malloc(0x10);
      *puVar5 = 0x10;
      pvVar6 = malloc(0x40);
      puVar5[1] = pvVar6;
      if (uVar12 + (int)lVar3 == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(pvVar4,0x80);
          }
          uVar9 = 0x10;
        }
        else {
          uVar10 = uVar9 * 2;
          if ((int)uVar9 < (int)uVar10) {
            uVar9 = uVar10;
            if (pvVar4 == (void *)0x0) {
              pvVar4 = malloc((ulong)uVar10 << 3);
            }
            else {
              pvVar4 = realloc(pvVar4,(ulong)uVar10 << 3);
            }
          }
        }
      }
      *(undefined8 **)((long)pvVar4 + lVar3 * 8 + (long)(int)uVar12 * 8) = puVar5;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 < p->nRegs);
    __ptr_00[1] = uVar12 + (int)lVar3;
    *__ptr_00 = uVar9;
    *(void **)(__ptr_00 + 2) = pvVar4;
  }
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      lVar16 = *(long *)((long)pvVar2 + lVar3 * 8);
      if (0 < *(int *)(lVar16 + 4)) {
        lVar11 = 0;
        do {
          iVar14 = *(int *)(*(long *)(lVar16 + 8) + lVar11 * 4);
          if (((long)iVar14 < 0) || ((int)__ptr_00[1] <= iVar14)) goto LAB_006c8856;
          Vec_IntPush(*(Vec_Int_t **)(*(long *)(__ptr_00 + 2) + (long)iVar14 * 8),(int)lVar3);
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)(lVar16 + 4));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != iVar1);
  }
  iVar14 = p->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar14 - 1U) {
    iVar8 = iVar14;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar7;
  pvVar4 = malloc((long)iVar14);
  memset(pvVar4,0,(long)iVar14);
  do {
    p_00->nSize = 0;
    uVar9 = p->nRegs;
    uVar13 = 0;
    if (0 < (int)uVar9) {
      do {
        if (*(char *)((long)pvVar4 + uVar13) == '\0') goto LAB_006c862d;
        uVar13 = uVar13 + 1;
      } while (uVar9 != uVar13);
      uVar13 = (ulong)uVar9;
    }
LAB_006c862d:
    if ((uint)uVar13 == uVar9) goto LAB_006c8736;
    *(undefined1 *)((long)pvVar4 + (uVar13 & 0xffffffff)) = 1;
    Vec_IntPush(p_00,(uint)uVar13);
    iVar14 = p_00->nSize;
    if (0 < iVar14) {
      lVar3 = 0;
      do {
        iVar14 = p_00->pArray[lVar3];
        lVar16 = (long)iVar14;
        if ((lVar16 < 0) || (iVar1 <= iVar14)) {
LAB_006c8856:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        lVar11 = *(long *)((long)pvVar2 + lVar16 * 8);
        if (0 < *(int *)(lVar11 + 4)) {
          lVar15 = 0;
          do {
            iVar8 = *(int *)(*(long *)(lVar11 + 8) + lVar15 * 4);
            if (*(char *)((long)pvVar4 + (long)iVar8) == '\0') {
              *(undefined1 *)((long)pvVar4 + (long)iVar8) = 1;
              Vec_IntPush(p_00,iVar8);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)(lVar11 + 4));
        }
        if ((int)__ptr_00[1] <= iVar14) goto LAB_006c8856;
        lVar16 = *(long *)(*(long *)(__ptr_00 + 2) + lVar16 * 8);
        if (0 < *(int *)(lVar16 + 4)) {
          lVar11 = 0;
          do {
            iVar14 = *(int *)(*(long *)(lVar16 + 8) + lVar11 * 4);
            if (*(char *)((long)pvVar4 + (long)iVar14) == '\0') {
              *(undefined1 *)((long)pvVar4 + (long)iVar14) = 1;
              Vec_IntPush(p_00,iVar14);
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < *(int *)(lVar16 + 4));
        }
        lVar3 = lVar3 + 1;
        iVar14 = p_00->nSize;
      } while (lVar3 < iVar14);
    }
    if (iVar14 == p->nRegs) {
      puts("There is only one SCC of registers in this network.");
LAB_006c8736:
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
      }
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      uVar9 = __ptr_00[1];
      if (0 < (long)(int)uVar9) {
        lVar3 = *(long *)(__ptr_00 + 2);
        lVar16 = 0;
        do {
          pvVar2 = *(void **)(lVar3 + lVar16 * 8);
          if (pvVar2 != (void *)0x0) {
            if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 8));
              *(undefined8 *)((long)pvVar2 + 8) = 0;
            }
            free(pvVar2);
          }
          lVar16 = lVar16 + 1;
        } while ((int)uVar9 != lVar16);
      }
      if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 2));
        __ptr_00[2] = 0;
        __ptr_00[3] = 0;
      }
      free(__ptr_00);
      if (0 < __ptr->nSize) {
        lVar3 = 0;
        do {
          pvVar2 = __ptr->pArray[lVar3];
          if (pvVar2 != (void *)0x0) {
            if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar2 + 8));
              *(undefined8 *)((long)pvVar2 + 8) = 0;
            }
            free(pvVar2);
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < __ptr->nSize);
      }
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (void **)0x0;
      }
      if (__ptr == (Vec_Ptr_t *)0x0) {
        return;
      }
      free(__ptr);
      return;
    }
    printf("SCC #%d contains %5d registers.\n");
  } while( true );
}

Assistant:

void Aig_ManComputeSccs( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix, * vMatrix2;
    Vec_Int_t * vSupp, * vSupp2, * vComp;
    char * pVarsTot;
    int i, k, m, iOut, iIn, nComps;
    if ( Aig_ManRegNum(p) == 0 )
    {
        printf( "The network is combinational.\n" );
        return;
    }
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
            continue;
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    // create the reverse matrix
    vMatrix2 = Vec_PtrAlloc( Aig_ManRegNum(p) );
    for ( i = 0; i < Aig_ManRegNum(p); i++ )
        Vec_PtrPush( vMatrix2, Vec_IntAlloc(8) );
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
    {
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iIn );
            Vec_IntPush( vSupp2, i );
        }
    } 

    // detect strongly connected components
    vComp = Vec_IntAlloc( Aig_ManRegNum(p) );
    pVarsTot = ABC_ALLOC( char, Aig_ManRegNum(p) );
    memset( pVarsTot, 0, Aig_ManRegNum(p) * sizeof(char) );
    for ( nComps = 0; ; nComps++ )
    {
        Vec_IntClear( vComp );
        // get the first support
        for ( iOut = 0; iOut < Aig_ManRegNum(p); iOut++ )
            if ( pVarsTot[iOut] == 0 )
                break;
        if ( iOut == Aig_ManRegNum(p) )
            break;
        pVarsTot[iOut] = 1;
        Vec_IntPush( vComp, iOut );
        Vec_IntForEachEntry( vComp, iOut, i )
        {
            vSupp = (Vec_Int_t *)Vec_PtrEntry( vMatrix, iOut );
            Vec_IntForEachEntry( vSupp, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iOut );
            Vec_IntForEachEntry( vSupp2, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
        }
        if ( Vec_IntSize(vComp) == Aig_ManRegNum(p) )
        {
            printf( "There is only one SCC of registers in this network.\n" );
            break;
        }
        printf( "SCC #%d contains %5d registers.\n", nComps+1, Vec_IntSize(vComp) );
    }
    ABC_FREE( pVarsTot );
    Vec_IntFree( vComp );
    Vec_PtrFree( vMatrix );
    Vec_VecFree( (Vec_Vec_t *)vMatrix2 );
    Vec_VecFree( (Vec_Vec_t *)vSupports );
}